

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O2

GLuint __thiscall ShaderDb::load_shader_file(ShaderDb *this,string *p_filepath,ShaderType p_type)

{
  GLuint p_id;
  ShaderType local_34;
  string local_30;
  
  local_34 = (ShaderType)p_filepath;
  read_shader_code_file(&local_30,(string *)this,p_type);
  p_id = compile_shader(&local_30,(ShaderType)p_filepath);
  if (p_id != 0) {
    add_shader_file(p_id,(string *)this,&local_30,&local_34);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return p_id;
}

Assistant:

GLuint ShaderDb::load_shader_file(
    const std::string &p_filepath,
    const ShaderType p_type) noexcept
{
    const auto &shader_data = read_shader_code_file(p_filepath, p_type);
    GLuint shader_id = compile_shader(shader_data, p_type);
    if (shader_id != DEFAULT_SHADER_ID)
    {
        return add_shader_file(
            shader_id,
            p_filepath,
            shader_data,
            p_type);
    }
    return shader_id;
}